

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::binder5<disp>::operator()
          (binder5<disp> *this,string *p1,string *p2,string *p3,string *p4,string *p5)

{
  ulong uVar1;
  ulong uVar2;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  ulong *in_RDI;
  string *in_R8;
  string *in_R9;
  page_guard<disp,_void> guard;
  disp *in_stack_fffffffffffffec8;
  code *pcVar3;
  page_guard<disp,_void> *in_stack_fffffffffffffed0;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [88];
  
  page_guard<disp,_void>::page_guard(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar1 = in_RDI[2];
  pcVar3 = (code *)*in_RDI;
  uVar2 = in_RDI[1];
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *(long *)(uVar1 + uVar2) + -1);
  }
  std::__cxx11::string::string(local_58,in_RSI);
  std::__cxx11::string::string(local_88,in_RDX);
  std::__cxx11::string::string(local_a8,in_RCX);
  std::__cxx11::string::string(local_c8,in_R8);
  std::__cxx11::string::string(local_e8,in_R9);
  (*pcVar3)((long *)(uVar1 + uVar2),local_58,local_88,local_a8,local_c8,local_e8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_58);
  page_guard<disp,_void>::~page_guard((page_guard<disp,_void> *)0x157169);
  return;
}

Assistant:

void operator()(std::string p1,std::string p2,std::string p3,std::string p4,std::string p5) const
			{
				page_guard<C> guard(object);
				(object->*member)(p1,p2,p3,p4,p5);
			}